

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS OutputStringObject(JlDataObject *StringObject,JlBuffer *JsonBuffer,
                            JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  char *pcVar1;
  _Bool escapeNonAscii;
  _Bool escapeSingleQuote;
  char *quoteCharStr;
  char *string;
  JL_STATUS jlStatus;
  uint32_t StackDepth_local;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlBuffer *JsonBuffer_local;
  JlDataObject *StringObject_local;
  
  quoteCharStr = (char *)0x0;
  pcVar1 = "\\\"";
  if ((OutputFlags & 8) != 0) {
    pcVar1 = "\\\'";
  }
  string._4_4_ = StackDepth;
  _jlStatus = OutputFlags;
  OutputFlags_local = (JL_OUTPUT_FLAGS)JsonBuffer;
  JsonBuffer_local = (JlBuffer *)StringObject;
  string._0_4_ = JlGetObjectString(StringObject,&quoteCharStr);
  if ((JL_STATUS)string == JL_STATUS_SUCCESS) {
    if (quoteCharStr == (char *)0x0) {
      string._0_4_ = JlBufferAdd((JlBuffer *)OutputFlags_local,"null",4);
    }
    else {
      string._0_4_ = JlBufferAdd((JlBuffer *)OutputFlags_local,pcVar1 + 1,1);
      if ((JL_STATUS)string == JL_STATUS_SUCCESS) {
        string._0_4_ = OutputUtf8String(quoteCharStr,(OutputFlags & 1) != 0,(OutputFlags & 8) != 0,
                                        (JlBuffer *)OutputFlags_local);
      }
      if ((JL_STATUS)string == JL_STATUS_SUCCESS) {
        string._0_4_ = JlBufferAdd((JlBuffer *)OutputFlags_local,pcVar1 + 1,1);
      }
    }
  }
  return (JL_STATUS)string;
}

Assistant:

JL_STATUS
    OutputStringObject
    (
        JlDataObject const*     StringObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    char const* string = NULL;
    char const* const quoteCharStr = OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES ? "\'" : "\"";
    bool escapeSingleQuote = (OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES) ? true : false;
    bool escapeNonAscii = (OutputFlags & JL_OUTPUT_FLAGS_ASCII) ? true : false;

    jlStatus = JlGetObjectString( StringObject, &string );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( NULL != string )
        {
            jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = OutputUtf8String( string, escapeNonAscii, escapeSingleQuote, JsonBuffer );
            }
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
            }
        }
        else
        {
            jlStatus = JlBufferAdd( JsonBuffer, "null", 4 );
        }
    }

    return jlStatus;
}